

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O0

void __thiscall
google::protobuf::TextFormat::Parser::ParserImpl::ReportError
          (ParserImpl *this,int line,int col,string *message)

{
  LogMessage *this_00;
  LogMessage *other;
  undefined8 in_RCX;
  undefined4 in_EDX;
  int in_ESI;
  long *in_RDI;
  LogMessage *in_stack_fffffffffffffed8;
  int line_00;
  LogMessage *in_stack_fffffffffffffee0;
  undefined8 in_stack_fffffffffffffee8;
  LogLevel_conflict level;
  LogMessage *in_stack_fffffffffffffef0;
  int in_stack_ffffffffffffff6c;
  LogMessage *in_stack_ffffffffffffff70;
  
  *(undefined1 *)(in_RDI + 0x20) = 1;
  if (*in_RDI == 0) {
    line_00 = (int)((ulong)in_stack_fffffffffffffed8 >> 0x20);
    level = (LogLevel_conflict)((ulong)in_stack_fffffffffffffee8 >> 0x20);
    if (in_ESI < 0) {
      internal::LogMessage::LogMessage
                (in_stack_fffffffffffffef0,level,(char *)in_stack_fffffffffffffee0,line_00);
      internal::LogMessage::operator<<(in_stack_fffffffffffffee0,(char *)in_stack_fffffffffffffed8);
      Descriptor::full_name_abi_cxx11_((Descriptor *)in_RDI[0x1d]);
      internal::LogMessage::operator<<
                (in_stack_fffffffffffffee0,(string *)in_stack_fffffffffffffed8);
      this_00 = internal::LogMessage::operator<<
                          (in_stack_fffffffffffffee0,(char *)in_stack_fffffffffffffed8);
      other = internal::LogMessage::operator<<(this_00,(string *)in_stack_fffffffffffffed8);
      internal::LogFinisher::operator=((LogFinisher *)this_00,other);
      internal::LogMessage::~LogMessage((LogMessage *)0x44d63d);
    }
    else {
      internal::LogMessage::LogMessage
                (in_stack_fffffffffffffef0,level,(char *)in_stack_fffffffffffffee0,line_00);
      internal::LogMessage::operator<<(in_stack_fffffffffffffee0,(char *)in_stack_fffffffffffffed8);
      Descriptor::full_name_abi_cxx11_((Descriptor *)in_RDI[0x1d]);
      internal::LogMessage::operator<<
                (in_stack_fffffffffffffee0,(string *)in_stack_fffffffffffffed8);
      internal::LogMessage::operator<<(in_stack_fffffffffffffee0,(char *)in_stack_fffffffffffffed8);
      internal::LogMessage::operator<<(in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c);
      internal::LogMessage::operator<<(in_stack_fffffffffffffee0,(char *)in_stack_fffffffffffffed8);
      internal::LogMessage::operator<<(in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c);
      internal::LogMessage::operator<<(in_stack_fffffffffffffee0,(char *)in_stack_fffffffffffffed8);
      internal::LogMessage::operator<<
                (in_stack_fffffffffffffee0,(string *)in_stack_fffffffffffffed8);
      internal::LogFinisher::operator=
                ((LogFinisher *)in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
      internal::LogMessage::~LogMessage((LogMessage *)0x44d556);
    }
  }
  else {
    (**(code **)(*(long *)*in_RDI + 0x10))((long *)*in_RDI,in_ESI,in_EDX,in_RCX);
  }
  return;
}

Assistant:

void ReportError(int line, int col, const std::string& message) {
    had_errors_ = true;
    if (error_collector_ == nullptr) {
      if (line >= 0) {
        GOOGLE_LOG(ERROR) << "Error parsing text-format "
                   << root_message_type_->full_name() << ": " << (line + 1)
                   << ":" << (col + 1) << ": " << message;
      } else {
        GOOGLE_LOG(ERROR) << "Error parsing text-format "
                   << root_message_type_->full_name() << ": " << message;
      }
    } else {
      error_collector_->AddError(line, col, message);
    }
  }